

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void luaV_concat(lua_State *L,int total)

{
  StkId pTVar1;
  lua_CFunction p_Var2;
  undefined4 uVar3;
  uint uVar4;
  ulong uVar5;
  TString *pTVar6;
  long lVar7;
  TValue *io1;
  TValue *p1;
  size_t sVar8;
  StkId pTVar9;
  ulong l;
  int iVar10;
  ulong uVar11;
  long lVar12;
  char buff [40];
  char local_58 [40];
  
  do {
    pTVar1 = L->top;
    p1 = pTVar1 + -2;
    if ((pTVar1[-2].tt_ & 0xfU) - 3 < 2) {
      pTVar9 = pTVar1 + -1;
      uVar4 = pTVar1[-1].tt_ & 0xf;
      if (uVar4 != 4) {
        if (uVar4 != 3) goto LAB_0011b8ac;
        luaO_tostring(L,pTVar9);
      }
      if ((pTVar1[-1].tt_ == 0x44) && ((pTVar9->value_).f[0xb] == (_func_int_lua_State_ptr)0x0)) {
        iVar10 = 1;
        if ((pTVar1[-2].tt_ & 0xfU) == 3) {
          luaO_tostring(L,p1);
        }
      }
      else {
        if ((pTVar1[-2].tt_ == 0x44) && ((p1->value_).f[0xb] == (_func_int_lua_State_ptr)0x0)) {
          iVar10 = pTVar1[-1].tt_;
          uVar3 = *(undefined4 *)&pTVar1[-1].field_0xc;
          p1->value_ = pTVar9->value_;
          pTVar1[-2].tt_ = iVar10;
          *(undefined4 *)&pTVar1[-2].field_0xc = uVar3;
          goto LAB_0011b8c7;
        }
        p_Var2 = (pTVar9->value_).f;
        if (p_Var2[8] == (_func_int_lua_State_ptr)0x4) {
          l = (ulong)(byte)p_Var2[0xb];
        }
        else {
          l = *(ulong *)(p_Var2 + 0x10);
        }
        uVar11 = 1;
        if (1 < total) {
          uVar11 = 1;
          do {
            uVar4 = p1->tt_ & 0xf;
            if (uVar4 != 4) {
              if (uVar4 != 3) goto LAB_0011b938;
              luaO_tostring(L,p1);
            }
            p_Var2 = (p1->value_).f;
            if (p_Var2[8] == (_func_int_lua_State_ptr)0x4) {
              uVar5 = (ulong)(byte)p_Var2[0xb];
            }
            else {
              uVar5 = *(ulong *)(p_Var2 + 0x10);
            }
            if ((l ^ 0x7fffffffffffffff) <= uVar5) {
              luaG_runerror(L,"string length overflow");
            }
            l = l + uVar5;
            uVar11 = uVar11 + 1;
            p1 = p1 + -1;
          } while ((uint)total != uVar11);
          uVar11 = (ulong)(uint)total;
        }
LAB_0011b938:
        uVar5 = uVar11 & 0xffffffff;
        if (l < 0x29) {
          lVar7 = uVar5 + 1;
          pTVar9 = pTVar1 + -uVar5;
          lVar12 = 0;
          do {
            p_Var2 = (pTVar9->value_).f;
            if (p_Var2[8] == (_func_int_lua_State_ptr)0x4) {
              sVar8 = (size_t)(byte)p_Var2[0xb];
            }
            else {
              sVar8 = *(size_t *)(p_Var2 + 0x10);
            }
            memcpy(local_58 + lVar12,p_Var2 + 0x18,sVar8);
            lVar12 = lVar12 + sVar8;
            lVar7 = lVar7 + -1;
            pTVar9 = pTVar9 + 1;
          } while (1 < lVar7);
          pTVar6 = luaS_newlstr(L,local_58,l);
        }
        else {
          pTVar6 = luaS_createlngstrobj(L,l);
          lVar7 = uVar5 + 1;
          pTVar9 = pTVar1 + -uVar5;
          lVar12 = 0;
          do {
            p_Var2 = (pTVar9->value_).f;
            if (p_Var2[8] == (_func_int_lua_State_ptr)0x4) {
              sVar8 = (size_t)(byte)p_Var2[0xb];
            }
            else {
              sVar8 = *(size_t *)(p_Var2 + 0x10);
            }
            memcpy((void *)((long)&pTVar6[1].next + lVar12),p_Var2 + 0x18,sVar8);
            lVar12 = lVar12 + sVar8;
            lVar7 = lVar7 + -1;
            pTVar9 = pTVar9 + 1;
          } while (1 < lVar7);
        }
        pTVar1[-uVar5].value_.gc = (GCObject *)pTVar6;
        pTVar1[-uVar5].tt_ = pTVar6->tt | 0x40;
        iVar10 = (int)uVar11 + -1;
      }
    }
    else {
LAB_0011b8ac:
      luaT_trybinTM(L,p1,pTVar1 + -1,p1,TM_CONCAT);
LAB_0011b8c7:
      iVar10 = 1;
    }
    total = total - iVar10;
    L->top = L->top + -(long)iVar10;
    if (total < 2) {
      return;
    }
  } while( true );
}

Assistant:

void luaV_concat(lua_State *L, int total) {
    lua_assert(total >= 2);
    do {
        StkId top = L->top;
        int n = 2;  /* number of elements handled in this pass (at least 2) */
        if (!(ttisstring(top - 2) || cvt2str(top - 2)) || !tostring(L, top - 1))
            luaT_trybinTM(L, top - 2, top - 1, top - 2, TM_CONCAT);
        else if (isemptystr(top - 1))  /* second operand is empty? */
            cast_void(tostring(L, top - 2));  /* result is first operand */
        else if (isemptystr(top - 2)) {  /* first operand is an empty string? */
            setobjs2s(L, top - 2, top - 1);  /* result is second op. */
        } else {
            /* at least two non-empty string values; get as many as possible */
            size_t tl = vslen(top - 1);
            TString *ts;
            /* collect total length and number of strings */
            for (n = 1; n < total && tostring(L, top - n - 1); n++) {
                size_t l = vslen(top - n - 1);
                if (l >= (MAX_SIZE / sizeof(char)) - tl)
                    luaG_runerror(L, "string length overflow");
                tl += l;
            }
            if (tl <= LUAI_MAXSHORTLEN) {  /* is result a short string? */
                char buff[LUAI_MAXSHORTLEN];
                copy2buff(top, n, buff);  /* copy strings to buffer */
                ts = luaS_newlstr(L, buff, tl);
            } else {  /* long string; copy strings directly to final result */
                ts = luaS_createlngstrobj(L, tl);
                copy2buff(top, n, getstr(ts));
            }
            setsvalue2s(L, top - n, ts);  /* create result */
        }
        total -= n - 1;  /* got 'n' strings to create 1 new */
        L->top -= n - 1;  /* popped 'n' strings and pushed one */
    } while (total > 1);  /* repeat until only 1 result left */
}